

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *
wasm::WATParser::locals<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
           *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  Lexer *this;
  _Uninitialized<wasm::Type,_true> _Var1;
  bool *this_00;
  long *plVar2;
  undefined8 *puVar3;
  bool bVar4;
  bool bVar5;
  MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *pMVar6;
  string_view expected;
  undefined1 auStack_100 [8];
  optional<wasm::Name> id;
  Result<wasm::Type> type;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  long *local_a0;
  undefined8 local_98;
  long local_90;
  undefined8 uStack_88;
  MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *local_80;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> local_78;
  undefined1 auStack_58 [8];
  Result<wasm::Type> _val;
  
  local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_finish = (NameType *)0x0;
  local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (NameType *)0x0;
  this = &ctx->in;
  bVar5 = false;
  this_00 = &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_engaged;
  local_80 = __return_storage_ptr__;
  do {
    expected._M_str = "local";
    expected._M_len = 5;
    bVar4 = Lexer::takeSExprStart(this,expected);
    if (!bVar4) {
      pMVar6 = local_80;
      if (bVar5) {
        *(pointer *)
         &(local_80->val).
          super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> =
             local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(local_80->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         8) = local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
              super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&(local_80->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         0x10) = local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        *(__index_type *)
         ((long)&(local_80->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         0x20) = '\0';
      }
      else {
        *(__index_type *)
         ((long)&(local_80->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         0x20) = '\x01';
LAB_00c1b2d6:
        if (local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.
                          super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      return pMVar6;
    }
    Lexer::takeID((optional<wasm::Name> *)auStack_100,this);
    pMVar6 = local_80;
    if (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\0') {
      valtype<wasm::WATParser::ParseDefsCtx>((Result<wasm::Type> *)this_00,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)auStack_58,
                 (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)this_00);
      if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
        local_a0 = &local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,auStack_58,
                   (undefined1 *)
                   ((long)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                          super__Move_assign_alias<wasm::Type,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first.
                          _M_storage.id + (long)auStack_58));
LAB_00c1b282:
        plVar2 = (long *)((long)&(pMVar6->val).
                                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                                 .
                                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         + 0x10);
        *(long **)&(pMVar6->val).
                   super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                   .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
             = plVar2;
        if (local_a0 == &local_90) {
          *plVar2 = local_90;
          *(undefined8 *)
           ((long)&(pMVar6->val).
                   super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                   .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
           + 0x18) = uStack_88;
        }
        else {
          *(long **)&(pMVar6->val).
                     super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                     .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
               = local_a0;
          *(long *)((long)&(pMVar6->val).
                           super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                           .
                           super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                   + 0x10) = local_90;
        }
        *(undefined8 *)
         ((long)&(pMVar6->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         8) = local_98;
        *(__index_type *)
         ((long)&(pMVar6->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         0x20) = '\x02';
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)auStack_58);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)auStack_58);
        bVar5 = Lexer::takeRParen(this);
        if (bVar5) {
          auStack_58 = auStack_100;
          _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.id =
               (_Uninitialized<wasm::Type,_true>)
               (_Uninitialized<wasm::Type,_true>)
               id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len
          ;
          _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_8_ =
               id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_;
          if (local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::
            _M_realloc_insert<wasm::NameType>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(NameType *)auStack_58);
          }
          else {
            ((local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
              super__Vector_impl_data._M_finish)->type).id =
                 id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._16_8_;
            ((local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
              super__Vector_impl_data._M_finish)->name).super_IString.str._M_len =
                 (size_t)auStack_100;
            ((local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
              super__Vector_impl_data._M_finish)->name).super_IString.str._M_str =
                 (char *)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.
                         str._M_len;
            local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::Err> *)this_00);
          goto LAB_00c1b258;
        }
        type.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = &local_b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
                   "expected end of local","");
        Lexer::err((Err *)auStack_58,this,
                   (string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        puVar3 = (undefined8 *)
                 ((long)&(pMVar6->val).
                         super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                 + 0x10);
        *(undefined8 **)
         &(pMVar6->val).
          super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> = puVar3;
        _Var1._M_storage.id =
             (Type)((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 8);
        if ((Type)auStack_58 == _Var1._M_storage.id) {
          *puVar3 = _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_8_;
          *(undefined8 *)
           ((long)&(pMVar6->val).
                   super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                   .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
           + 0x18) = _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(pMVar6->val).
            super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> =
               auStack_58;
          *(undefined8 *)
           ((long)&(pMVar6->val).
                   super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                   .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
           + 0x10) = _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_8_;
        }
        ((_Uninitialized<wasm::Type,_true> *)
        ((long)&(pMVar6->val).
                super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> + 8
        ))->_M_storage =
             (Type)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.id;
        _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.id =
             (_Uninitialized<wasm::Type,_true>)(Type)0x0;
        _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_8_ =
             _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_8_ & 0xffffffffffffff00;
        *(__index_type *)
         ((long)&(pMVar6->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         0x20) = '\x02';
        auStack_58 = (undefined1  [8])_Var1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)type.val.super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ != &local_b0) {
          operator_delete((void *)type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_,
                          local_b0._M_allocated_capacity + 1);
        }
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
                 &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged);
      goto LAB_00c1b2d6;
    }
    while( true ) {
      bVar5 = Lexer::takeRParen(this);
      if (bVar5) break;
      valtype<wasm::WATParser::ParseDefsCtx>((Result<wasm::Type> *)this_00,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)auStack_58,
                 (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)this_00);
      if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
        local_a0 = &local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,auStack_58,
                   (undefined1 *)
                   ((long)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                          super__Move_assign_alias<wasm::Type,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first.
                          _M_storage.id + (long)auStack_58));
        goto LAB_00c1b282;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)auStack_58);
      auStack_58 = (undefined1  [8])0x0;
      _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.id =
           (_Uninitialized<wasm::Type,_true>)(Type)0x0;
      _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_8_ =
           id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._16_8_;
      if (local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::
        _M_realloc_insert<wasm::NameType>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(NameType *)auStack_58);
      }
      else {
        ((local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
          super__Vector_impl_data._M_finish)->type).id =
             id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._16_8_;
        ((local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
          super__Vector_impl_data._M_finish)->name).super_IString.str._M_len = 0;
        ((local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
          super__Vector_impl_data._M_finish)->name).super_IString.str._M_str = (char *)0x0;
        local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)this_00);
    }
LAB_00c1b258:
    bVar5 = true;
  } while( true );
}

Assistant:

MaybeResult<typename Ctx::LocalsT> locals(Ctx& ctx) {
  bool hasAny = false;
  auto res = ctx.makeLocals();
  while (ctx.in.takeSExprStart("local"sv)) {
    hasAny = true;
    if (auto id = ctx.in.takeID()) {
      // Single named local
      auto type = valtype(ctx);
      CHECK_ERR(type);
      if (!ctx.in.takeRParen()) {
        return ctx.in.err("expected end of local");
      }
      ctx.appendLocal(res, *id, *type);
    } else {
      // Repeated unnamed locals
      while (!ctx.in.takeRParen()) {
        auto type = valtype(ctx);
        CHECK_ERR(type);
        ctx.appendLocal(res, {}, *type);
      }
    }
  }
  if (hasAny) {
    return res;
  }
  return {};
}